

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FunctionBody.cpp
# Opt level: O0

bool __thiscall
Js::FunctionBody::GetLineCharOffsetFromStartChar
          (FunctionBody *this,int startCharOfStatement,ULONG *_line,LONG *_charOffset,
          bool canAllocateLineCache)

{
  code *pcVar1;
  bool bVar2;
  ULONG UVar3;
  Utf8SourceInfo *pUVar4;
  undefined4 *puVar5;
  SourceContextInfo *this_00;
  SRCINFO *pSVar6;
  charcount_t local_50;
  HRESULT local_4c;
  charcount_t cacheLine;
  HRESULT hr;
  int iStack_40;
  bool doSlowLookup;
  charcount_t lineByteOffset;
  ULONG lineCharOffset;
  charcount_t column;
  ULONG line;
  bool canAllocateLineCache_local;
  LONG *_charOffset_local;
  ULONG *_line_local;
  FunctionBody *pFStack_18;
  int startCharOfStatement_local;
  FunctionBody *this_local;
  
  column._3_1_ = canAllocateLineCache;
  _line = (charcount_t *)_charOffset;
  _charOffset_local = (LONG *)_line;
  _line_local._4_4_ = startCharOfStatement;
  pFStack_18 = this;
  pUVar4 = FunctionProxy::GetUtf8SourceInfo((FunctionProxy *)this);
  bVar2 = Utf8SourceInfo::GetIsLibraryCode(pUVar4);
  if ((bVar2) && (bVar2 = FunctionProxy::IsJsBuiltInCode((FunctionProxy *)this), !bVar2)) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar5 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Base/FunctionBody.cpp"
                                ,0xc95,
                                "(!this->GetUtf8SourceInfo()->GetIsLibraryCode() || this->IsJsBuiltInCode())"
                                ,
                                "!this->GetUtf8SourceInfo()->GetIsLibraryCode() || this->IsJsBuiltInCode()"
                               );
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar5 = 0;
  }
  lineCharOffset = FunctionProxy::GetHostStartLine((FunctionProxy *)this);
  lineByteOffset = 0;
  iStack_40 = 0;
  hr = 0;
  if (0 < (int)_line_local._4_4_) {
    cacheLine._3_1_ = (column._3_1_ ^ 0xff) & 1;
    if ((column._3_1_ & 1) != 0) {
      pUVar4 = FunctionProxy::GetUtf8SourceInfo((FunctionProxy *)this);
      local_4c = Utf8SourceInfo::EnsureLineOffsetCacheNoThrow(pUVar4);
      if (local_4c < 0) {
        if (local_4c != -0x7ff8fff2) {
          if (local_4c != -0x7fffbffc) {
            AssertCount = AssertCount + 1;
            Throw::LogAssert();
            puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
            *puVar5 = 1;
            bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Base/FunctionBody.cpp"
                                        ,0xca7,"(hr == ((HRESULT)0x80004004L))","hr == E_ABORT");
            if (!bVar2) {
              pcVar1 = (code *)invalidInstructionException();
              (*pcVar1)();
            }
            puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
            *puVar5 = 0;
          }
          return false;
        }
        pUVar4 = FunctionProxy::GetUtf8SourceInfo((FunctionProxy *)this);
        Utf8SourceInfo::DeleteLineOffsetCache(pUVar4);
        cacheLine._3_1_ = 1;
      }
    }
    local_50 = 0;
    pUVar4 = FunctionProxy::GetUtf8SourceInfo((FunctionProxy *)this);
    Utf8SourceInfo::GetLineInfoForCharPosition
              (pUVar4,_line_local._4_4_,&local_50,&lineByteOffset,(charcount_t *)&hr,
               (bool)(cacheLine._3_1_ & 1));
    if (local_50 != 0) {
      lineCharOffset = local_50 + lineCharOffset;
      iStack_40 = _line_local._4_4_ - lineByteOffset;
    }
  }
  this_00 = FunctionProxy::GetSourceContextInfo((FunctionProxy *)this);
  bVar2 = SourceContextInfo::IsDynamic(this_00);
  if ((bVar2) &&
     (((byte)(this->super_ParseableFunctionInfo).super_FunctionProxy.field_0x47 >> 1 & 1) != 0)) {
    lineCharOffset = lineCharOffset - 1;
  }
  if (_charOffset_local != (LONG *)0x0) {
    *_charOffset_local = lineCharOffset;
  }
  if (_line != (charcount_t *)0x0) {
    *_line = lineByteOffset;
    pSVar6 = FunctionProxy::GetHostSrcInfo((FunctionProxy *)this);
    if (pSVar6->dlnHost == lineCharOffset) {
      UVar3 = FunctionProxy::GetHostStartColumn((FunctionProxy *)this);
      *_line = UVar3 + *_line;
    }
  }
  return true;
}

Assistant:

bool FunctionBody::GetLineCharOffsetFromStartChar(int startCharOfStatement, ULONG* _line, LONG* _charOffset, bool canAllocateLineCache /*= true*/)
    {
        Assert(!this->GetUtf8SourceInfo()->GetIsLibraryCode() || this->IsJsBuiltInCode());

        // The following adjusts for where the script is within the document
        ULONG line = this->GetHostStartLine();
        charcount_t column = 0;
        ULONG lineCharOffset = 0;
        charcount_t lineByteOffset = 0;

        if (startCharOfStatement > 0)
        {
            bool doSlowLookup = !canAllocateLineCache;
            if (canAllocateLineCache)
            {
                HRESULT hr = this->GetUtf8SourceInfo()->EnsureLineOffsetCacheNoThrow();
                if (FAILED(hr))
                {
                    if (hr != E_OUTOFMEMORY)
                    {
                        Assert(hr == E_ABORT); // The only other possible error we know about is ScriptAbort from QueryContinue.
                        return false;
                    }

                    // Clear the cache so it is not used.
                    this->GetUtf8SourceInfo()->DeleteLineOffsetCache();

                    // We can try and do the slow lookup below
                    doSlowLookup = true;
                }
            }

            charcount_t cacheLine = 0;
            this->GetUtf8SourceInfo()->GetLineInfoForCharPosition(startCharOfStatement, &cacheLine, &column, &lineByteOffset, doSlowLookup);

            // Update the tracking variables to jump to the line position (only need to jump if not on the first line).
            if (cacheLine > 0)
            {
                line += cacheLine;
                lineCharOffset = startCharOfStatement - column;
            }
        }

        if (this->GetSourceContextInfo()->IsDynamic() && this->m_isDynamicFunction)
        {
            line -= JavascriptFunction::numberLinesPrependedToAnonymousFunction;
        }

        if(_line)
        {
            *_line = line;
        }

        if(_charOffset)
        {
            *_charOffset = column;

            // If we are at the beginning of the host code, adjust the offset based on the host provided offset
            if (this->GetHostSrcInfo()->dlnHost == line)
            {
                *_charOffset += (LONG)this->GetHostStartColumn();
            }
        }

        return true;
    }